

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::PrefixOperator,bool>
               (string_t *ldata,string_t *rdata,bool *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  sel_t *psVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  byte bVar4;
  undefined1 auVar5 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  _Head_base<0UL,_unsigned_long_*,_false> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  ulong uVar10;
  char *pcVar11;
  bool bVar12;
  idx_t idx_in_entry;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  undefined1 local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  undefined8 local_58;
  char *local_50;
  bool *local_48;
  buffer_ptr<ValidityBuffer> *local_40;
  ulong local_38;
  
  local_48 = result_data;
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar1 = lsel->sel_vector;
      psVar2 = rsel->sel_vector;
      uVar14 = 0;
      do {
        uVar15 = uVar14;
        if (psVar1 != (sel_t *)0x0) {
          uVar15 = (ulong)psVar1[uVar14];
        }
        uVar10 = uVar14;
        if (psVar2 != (sel_t *)0x0) {
          uVar10 = (ulong)psVar2[uVar14];
        }
        p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ldata[uVar15].value.pointer.ptr
        ;
        local_58 = *(idx_t *)&rdata[uVar10].value;
        local_50 = rdata[uVar10].value.pointer.ptr;
        uVar13 = (uint)local_58;
        uVar17 = (uint)*(undefined8 *)&ldata[uVar15].value;
        if (uVar17 < uVar13) {
LAB_0110f8a6:
          bVar12 = false;
        }
        else if (uVar13 < 5) {
          bVar12 = true;
          if (uVar13 != 0) {
            uVar15 = 0;
            do {
              if (local_68[uVar15 + 4] != *(char *)((long)&local_58 + uVar15 + 4))
              goto LAB_0110f8a6;
              uVar15 = uVar15 + 1;
            } while ((local_58 & 0xffffffff) != uVar15);
          }
        }
        else {
          lVar16 = 0;
          do {
            if (local_68[lVar16 + 4] != *(char *)((long)&local_58 + lVar16 + 4)) goto LAB_0110f8a6;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 4);
          if (uVar17 < 0xd) {
            p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 4);
          }
          if (uVar13 < 0xd) {
            local_50 = (char *)((long)&local_58 + 4);
          }
          uVar15 = 4;
          do {
            if (*(char *)((long)p_Stack_60 + uVar15) != local_50[uVar15]) goto LAB_0110f8a6;
            uVar15 = uVar15 + 1;
          } while ((local_58 & 0xffffffff) != uVar15);
          bVar12 = true;
        }
        result_data[uVar14] = bVar12;
        uVar14 = uVar14 + 1;
      } while (uVar14 != count);
    }
  }
  else if (count != 0) {
    psVar1 = lsel->sel_vector;
    psVar2 = rsel->sel_vector;
    local_40 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar14 = 0;
    local_38 = count;
    do {
      uVar15 = uVar14;
      if (psVar1 != (sel_t *)0x0) {
        uVar15 = (ulong)psVar1[uVar14];
      }
      uVar10 = uVar14;
      if (psVar2 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar2[uVar14];
      }
      puVar3 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0))
         && ((puVar3 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar3 == (unsigned_long *)0x0 || ((puVar3[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0)))
         ) {
        local_68 = *(undefined1 (*) [8])&ldata[uVar15].value;
        p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ldata[uVar15].value.pointer.ptr
        ;
        local_58 = *(idx_t *)&rdata[uVar10].value;
        local_50 = rdata[uVar10].value.pointer.ptr;
        uVar13 = (uint)local_58;
        if (SUB84(local_68,0) < uVar13) {
LAB_0110f9d5:
          bVar12 = false;
        }
        else if (uVar13 < 5) {
          bVar12 = true;
          if (uVar13 != 0) {
            uVar15 = 0;
            do {
              if (local_68[uVar15 + 4] != *(char *)((long)&local_58 + uVar15 + 4))
              goto LAB_0110f9d5;
              uVar15 = uVar15 + 1;
            } while ((local_58 & 0xffffffff) != uVar15);
          }
        }
        else {
          lVar16 = 0;
          do {
            if (local_68[lVar16 + 4] != *(char *)((long)&local_58 + lVar16 + 4)) goto LAB_0110f9d5;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 4);
          p_Var9 = p_Stack_60;
          if (SUB84(local_68,0) < 0xd) {
            p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 4);
          }
          pcVar11 = local_50;
          if (uVar13 < 0xd) {
            pcVar11 = (char *)((long)&local_58 + 4);
          }
          uVar15 = 4;
          do {
            if (*(char *)((long)&p_Var9->_vptr__Sp_counted_base + uVar15) != pcVar11[uVar15])
            goto LAB_0110f9d5;
            uVar15 = uVar15 + 1;
          } while ((local_58 & 0xffffffff) != uVar15);
          bVar12 = true;
        }
        local_48[uVar14] = bVar12;
      }
      else {
        _Var8._M_head_impl =
             (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var8._M_head_impl == (unsigned_long *)0x0) {
          local_58 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_68,&local_58);
          p_Var6 = p_Stack_60;
          auVar5 = local_68;
          local_68 = (undefined1  [8])0x0;
          p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var9 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)auVar5;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var6;
          if ((p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9),
             p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
          }
          pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_40);
          _Var8._M_head_impl =
               (pTVar7->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var8._M_head_impl;
          count = local_38;
        }
        bVar4 = (byte)uVar14 & 0x3f;
        _Var8._M_head_impl[uVar14 >> 6] =
             _Var8._M_head_impl[uVar14 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != count);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}